

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

void __thiscall
Diligent::RefCntAutoPtr<Diligent::ShaderResourceBindingGLImpl>::Release
          (RefCntAutoPtr<Diligent::ShaderResourceBindingGLImpl> *this)

{
  RefCntAutoPtr<Diligent::ShaderResourceBindingGLImpl> *this_local;
  
  if (this->m_pObject != (ShaderResourceBindingGLImpl *)0x0) {
    RefCountedObject<Diligent::IShaderResourceBindingGL>::Release
              ((RefCountedObject<Diligent::IShaderResourceBindingGL> *)this->m_pObject);
    this->m_pObject = (ShaderResourceBindingGLImpl *)0x0;
  }
  return;
}

Assistant:

void Release() noexcept
    {
        if (m_pObject)
        {
            m_pObject->Release();
            m_pObject = nullptr;
        }
    }